

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  bool bVar6;
  int iVar7;
  ImGuiTableCellData *pIVar8;
  long lVar9;
  ImU32 col;
  ImGuiTableCellData *pIVar10;
  long lVar11;
  ImGuiTableCellData *pIVar12;
  ImU32 col_00;
  ImGuiTableColumn *pIVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  ImVec2 local_60;
  ImVec2 local_58;
  ImU32 local_4c;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4 != table->InnerWindow) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f5,"TableEndRow","ImGui ASSERT FAILED: %s","window == table->InnerWindow");
  }
  if (table->IsInsideRow == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f6,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsInsideRow");
  }
  TableEndCell(table);
  fVar18 = table->RowPosY2;
  auVar19 = ZEXT416((uint)fVar18);
  (pIVar4->DC).CursorPos.y = fVar18;
  fVar1 = table->RowPosY1;
  iVar7 = table->CurrentRow;
  bVar6 = table->FreezeRowsCount < 1;
  bVar14 = iVar7 + 1 != (int)table->FreezeRowsCount;
  if (iVar7 == 0) {
    table->LastFirstRowHeight = fVar18 - fVar1;
LAB_001ef60a:
    if ((fVar18 < (table->InnerClipRect).Min.y) || ((table->InnerClipRect).Max.y < fVar1))
    goto LAB_001ef624;
    col_00 = table->RowBgColor[0];
    local_48 = auVar19;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar7 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    if (col == 0x1000000) {
      col = 0;
    }
    local_4c = 0;
    if (((iVar7 != 0) && (local_4c = 0, 0 < iVar7)) && ((table->Flags & 0x80U) != 0)) {
      local_4c = table->RowBgColor[(ulong)((table->field_0x96 & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCount;
    if (('\0' < cVar3 || !bVar14 && !bVar6) || (local_4c != 0 || (col != 0 || col_00 != 0))) {
      fVar18 = (table->HostClipRect).Min.y;
      fVar17 = (table->HostClipRect).Max.x;
      fVar22 = (table->HostClipRect).Max.y;
      pIVar5 = pIVar4->DrawList;
      (pIVar5->_CmdHeader).ClipRect.x = (table->HostClipRect).Min.x;
      (pIVar5->_CmdHeader).ClipRect.y = fVar18;
      (pIVar5->_CmdHeader).ClipRect.z = fVar17;
      (pIVar5->_CmdHeader).ClipRect.w = fVar22;
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BackgroundClipRect).Min;
      fVar18 = (table->WorkRect).Min.x;
      fVar17 = IVar2.x;
      fVar22 = IVar2.y;
      uVar15 = -(uint)(fVar17 <= fVar18);
      uVar16 = -(uint)(fVar22 <= fVar1);
      local_60.y = (float)(~uVar16 & (uint)fVar22 | (uint)fVar1 & uVar16);
      local_60.x = (float)(~uVar15 & (uint)fVar17 | (uint)fVar18 & uVar15);
      auVar23._8_8_ = 0;
      auVar23._0_4_ = (table->BackgroundClipRect).Max.x;
      auVar23._4_4_ = (table->BackgroundClipRect).Max.y;
      auVar19._4_4_ = local_48._0_4_;
      auVar19._0_4_ = (table->WorkRect).Max.x;
      auVar19._8_4_ = 0;
      auVar19._12_4_ = local_48._4_4_;
      auVar19 = minps(auVar19,auVar23);
      local_58 = auVar19._0_8_;
      if ((col_00 != 0) && (local_60.y < auVar19._4_4_)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_60,&local_58,col_00,0.0,0xf);
      }
      if (col != 0) {
        if (local_60.y < local_58.y) {
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_60,&local_58,col,0.0,0xf);
        }
      }
    }
    if ('\0' < cVar3) {
      pIVar12 = (table->RowCellData).Data;
      pIVar8 = (table->RowCellData).DataEnd;
      pIVar10 = pIVar12 + (long)table->RowCellDataCount + -1;
      if (pIVar8 <= pIVar10) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        pIVar12 = (table->RowCellData).Data;
        pIVar8 = (table->RowCellData).DataEnd;
      }
      if (pIVar8 <= pIVar12) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
      }
      for (; pIVar12 <= pIVar10; pIVar12 = pIVar12 + 1) {
        pIVar13 = (table->Columns).Data + pIVar12->Column;
        if ((table->Columns).DataEnd <= pIVar13) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        fVar18 = pIVar13->MinX - table->CellSpacingX;
        IVar2 = (table->BackgroundClipRect).Min;
        fVar17 = IVar2.x;
        fVar22 = IVar2.y;
        uVar15 = -(uint)(fVar17 <= fVar18);
        uVar16 = -(uint)(fVar22 <= fVar1);
        local_60 = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar22,~uVar15 & (uint)fVar17) |
                           CONCAT44((uint)fVar1 & uVar16,(uint)fVar18 & uVar15));
        auVar21._8_8_ = 0;
        auVar21._0_4_ = (table->BackgroundClipRect).Max.x;
        auVar21._4_4_ = (table->BackgroundClipRect).Max.y;
        auVar20._4_4_ = local_48._0_4_;
        auVar20._0_4_ = pIVar13->MaxX;
        auVar20._8_4_ = 0;
        auVar20._12_4_ = local_48._4_4_;
        auVar19 = minps(auVar20,auVar21);
        local_58 = auVar19._0_8_;
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_60,&local_58,pIVar12->BgColor,0.0,0xf);
      }
    }
    if (((local_4c != 0) && ((table->BackgroundClipRect).Min.y <= fVar1)) &&
       (fVar1 < (table->BackgroundClipRect).Max.y)) {
      local_60.y = fVar1;
      local_60.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar1;
      ImDrawList::AddLine(pIVar4->DrawList,&local_60,&local_38,local_4c,1.0);
    }
    if (bVar14 || bVar6) goto LAB_001efb52;
    if (((table->BackgroundClipRect).Min.y <= (float)local_48._0_4_) &&
       ((float)local_48._0_4_ < (table->BackgroundClipRect).Max.y)) {
      local_60.y = (float)local_48._0_4_;
      local_60.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_60,&local_38,table->BorderColorStrong,1.0);
    }
  }
  else {
    if (-1 < iVar7) goto LAB_001ef60a;
LAB_001ef624:
    if (bVar14 || bVar6) goto LAB_001efb52;
  }
  if (table->IsFreezeRowsPassed != false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x255a,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsFreezeRowsPassed == false"
               );
  }
  table->IsFreezeRowsPassed = true;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
  fVar18 = table->RowPosY2;
  fVar1 = (pIVar4->InnerClipRect).Min.y;
  fVar17 = (pIVar4->InnerClipRect).Max.y;
  uVar15 = -(uint)(fVar1 <= fVar18 + 1.0);
  fVar22 = (float)(~uVar15 & (uint)fVar1 | (uint)(fVar18 + 1.0) & uVar15);
  fVar1 = (table->InnerClipRect).Max.x;
  (table->BackgroundClipRect).Min.x = (table->InnerClipRect).Min.x;
  (table->BackgroundClipRect).Min.y = fVar22;
  (table->BackgroundClipRect).Max.x = fVar1;
  (table->BackgroundClipRect).Max.y = fVar17;
  fVar1 = table->RowPosY1;
  fVar17 = (fVar18 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
  (pIVar4->DC).CursorPos.y = fVar17;
  table->RowPosY2 = fVar17;
  table->RowPosY1 = fVar17 - (fVar18 - fVar1);
  iVar7 = table->ColumnsCount;
  if (0 < iVar7) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      pIVar13 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar13->ClipRect).Min.x + lVar9)
         ) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        iVar7 = table->ColumnsCount;
      }
      (&pIVar13->DrawChannelCurrent)[lVar9] = (&pIVar13->DrawChannelRowsAfterFreeze)[lVar9];
      *(float *)((long)&(pIVar13->ClipRect).Min.y + lVar9) = fVar22;
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x68;
    } while (lVar11 < iVar7);
  }
LAB_001efb52:
  if ((table->field_0x94 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void    ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;

    const bool unfreeze_rows = (table->CurrentRow + 1 == table->FreezeRowsCount && table->FreezeRowsCount > 0);

    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = table->CurrentRow >= 0 && bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y;
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow != 0 || table->InnerWindow == table->OuterWindow)
        {
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
            {
                //if (table->CurrentRow == 0 && table->InnerWindow == table->OuterWindow)
                //    border_col = table->BorderOuterColor;
                //else
                if (table->CurrentRow > 0)// && !(table->LastRowFlags & ImGuiTableRowFlags_Headers))
                    border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;
            }
            else
            {
                //if (table->RowFlags & ImGuiTableRowFlags_Headers)
                //    border_col = table->BorderOuterColor;
            }
        }

        const bool draw_cell_bg_color = table->RowCellDataCount > 0;
        const bool draw_strong_bottom_border = unfreeze_rows;// || (table->RowFlags & ImGuiTableRowFlags_Headers);
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeChannelChange() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            window->DrawList->_CmdHeader.ClipRect = table->HostClipRect.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BackgroundClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCount - 1];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_rect(column->MinX - table->CellSpacingX, bg_y1, column->MaxX, bg_y2); // FIXME-TABLE: Padding currently wrong until we finish the padding refactor
                cell_rect.ClipWith(table->BackgroundClipRect);
                window->DrawList->AddRectFilled(cell_rect.Min, cell_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BackgroundClipRect.Min.y && bg_y1 < table->BackgroundClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border)
            if (bg_y2 >= table->BackgroundClipRect.Min.y && bg_y2 < table->BackgroundClipRect.Max.y)
                window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows)
    {
        IM_ASSERT(table->IsFreezeRowsPassed == false);
        table->IsFreezeRowsPassed = true;
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);

        ImRect r;
        r.Min.x = table->InnerClipRect.Min.x;
        r.Min.y = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        r.Max.x = table->InnerClipRect.Max.x;
        r.Max.y = window->InnerClipRect.Max.y;
        table->BackgroundClipRect = r;

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelRowsAfterFreeze;
            column->ClipRect.Min.y = r.Min.y;
        }
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}